

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

int __thiscall QDate::dayOfYear(QDate *this,QCalendar cal)

{
  long lVar1;
  int year;
  QDate QVar2;
  int iVar3;
  long in_FS_OFFSET;
  QCalendar cal_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = 0;
  cal_local.d_ptr = cal.d_ptr;
  if (this->jd + 0xb69eeff91fU < 0x16d3e147974) {
    year = QDate::year(this,cal);
    QVar2 = QCalendar::dateFromParts(&cal_local,year,1,1);
    if ((QVar2.jd + 0xb69eeff91fU < 0x16d3e147974) &&
       (iVar3 = ((int)this->jd - (int)QVar2.jd) + 1, this->jd - 0xb69f248055U < 0xfffffe92c1eb868c))
    {
      iVar3 = 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int QDate::dayOfYear(QCalendar cal) const
{
    if (isValid()) {
        QDate firstDay = cal.dateFromParts(year(cal), 1, 1);
        if (firstDay.isValid())
            return firstDay.daysTo(*this) + 1;
    }
    return 0;
}